

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O2

size_t PAL_fwrite(void *pvBuffer,size_t nSize,size_t nCount,PAL_FILE *pf)

{
  size_t sVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (pf == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_fwrite",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
              ,0x1fb);
      fprintf(_stderr,"Expression: pf != NULL\n");
    }
    sVar1 = CorUnix::InternalFwrite(pvBuffer,nSize,nCount,pf->bsdFilePtr,&pf->PALferrorCode);
    if (PAL_InitializeChakraCoreCalled != false) {
      return sVar1;
    }
  }
  abort();
}

Assistant:

size_t
__cdecl
PAL_fwrite(
    const void *pvBuffer,
    size_t nSize,
    size_t nCount,
    PAL_FILE *pf
    )
{
    size_t nWrittenBytes = 0;

    PERF_ENTRY(fwrite);
    ENTRY( "fwrite( pvBuffer=%p, nSize=%d, nCount=%d, pf=%p )\n",
           pvBuffer, nSize, nCount, pf);
    _ASSERTE(pf != NULL);

    nWrittenBytes = InternalFwrite(pvBuffer, nSize, nCount, pf->bsdFilePtr, &pf->PALferrorCode);

    LOGEXIT( "fwrite returning size_t %d\n", nWrittenBytes );
    PERF_EXIT(fwrite);
    return nWrittenBytes;
}